

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int string_get_hex(JSString *p,int k,int n)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  if (n < 1) {
    return 0;
  }
  lVar3 = (long)k;
  uVar2 = n + 1;
  uVar1 = 0;
  do {
    if ((int)*(undefined8 *)&p->field_0x4 < 0) {
      uVar4 = (uint)*(ushort *)((long)&p[1].header.ref_count + lVar3 * 2);
    }
    else {
      uVar4 = (uint)*(byte *)((long)&p[1].header.ref_count + lVar3);
    }
    uVar5 = uVar4 - 0x30;
    if (9 < uVar5) {
      if (uVar4 - 0x41 < 6) {
        uVar5 = uVar4 - 0x37;
      }
      else {
        if (uVar4 - 0x67 < 0xfffffffa) {
          return -1;
        }
        uVar5 = uVar4 - 0x57;
      }
    }
    lVar3 = lVar3 + 1;
    uVar1 = uVar1 << 4 | uVar5;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  return uVar1;
}

Assistant:

static int string_get_hex(JSString *p, int k, int n) {
    int c = 0, h;
    while (n-- > 0) {
        if ((h = from_hex(string_get(p, k++))) < 0)
            return -1;
        c = (c << 4) | h;
    }
    return c;
}